

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string * duckdb::NumericHelper::ToString<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short value)

{
  undefined2 in_register_00000032;
  
  std::__cxx11::to_string(__return_storage_ptr__,CONCAT22(in_register_00000032,value));
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}